

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeKernelCreate
          (ze_module_handle_t hModule,ze_kernel_desc_t *desc,ze_kernel_handle_t *phKernel)

{
  _func_void__ze_kernel_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_module_handle_t_ptr__ze_kernel_desc_t_ptr__ze_kernel_handle_t_ptr_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_100;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_e8;
  undefined1 local_d0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnKernelCreateCb_t epilogue_callback_ptr;
  ze_pfnKernelCreateCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_kernel_create_params_t tracerParams;
  ze_pfnKernelCreate_t pfnCreate;
  ze_kernel_handle_t *phKernel_local;
  ze_kernel_desc_t *desc_local;
  ze_module_handle_t hModule_local;
  
  if (DAT_002da790 ==
      (_func__ze_result_t__ze_module_handle_t_ptr__ze_kernel_desc_t_ptr__ze_kernel_handle_t_ptr_ptr
       *)0x0) {
    hModule_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnCreate = (ze_pfnKernelCreate_t)phKernel;
    phKernel_local = (ze_kernel_handle_t *)desc;
    desc_local = (ze_kernel_desc_t *)hModule;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&desc_local;
      APITracerCallbackDataImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnKernelCreateCb_t)0x0;
            prologueCallbackPtr < (ze_pfnKernelCreateCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x478);
          p_Var1 = *(_func_void__ze_kernel_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **
                    )(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xad0);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_kernel_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr **)
                (puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_d0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_d0)
          ;
        }
      }
      zeApiPtr = DAT_002da790;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_e8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_100,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hModule_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_module_handle_t*,_ze_kernel_desc_t_const*,_ze_kernel_handle_t**),_ze_kernel_create_params_t*,void(*)(_ze_kernel_create_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_create_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_create_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_create_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_create_params_t*,_ze_result_t,void*,void**)>>>,_ze_module_handle_t*&,_ze_kernel_desc_t_const*&,_ze_kernel_handle_t**&>
                     (zeApiPtr,(_ze_kernel_create_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_kernel_create_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_e8,&local_100,
                      (_ze_module_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_kernel_desc_t **)&phKernel_local,(_ze_kernel_handle_t ***)&pfnCreate);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_100);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_e8);
      APITracerCallbackDataImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_kernel_create_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hModule_local._4_4_ =
           (*DAT_002da790)((_ze_module_handle_t *)desc_local,(_ze_kernel_desc_t *)phKernel_local,
                           (_ze_kernel_handle_t **)pfnCreate);
    }
  }
  return hModule_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelCreate(
        ze_module_handle_t hModule,                     ///< [in] handle of the module
        const ze_kernel_desc_t* desc,                   ///< [in] pointer to kernel descriptor
        ze_kernel_handle_t* phKernel                    ///< [out] handle of the Function object
        )
    {
        auto pfnCreate = context.zeDdiTable.Kernel.pfnCreate;

        if( nullptr == pfnCreate)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Kernel.pfnCreate, hModule, desc, phKernel);

        // capture parameters
        ze_kernel_create_params_t tracerParams = {
            &hModule,
            &desc,
            &phKernel
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnKernelCreateCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnKernelCreateCb_t, Kernel, pfnCreateCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Kernel.pfnCreate,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phModule,
                                                  *tracerParams.pdesc,
                                                  *tracerParams.pphKernel);
    }